

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O3

unsigned_long
duckdb::NumericCastImpl<unsigned_long,_duckdb::hugeint_t,_false>::Convert(hugeint_t val)

{
  hugeint_t params;
  bool bVar1;
  uint64_t uVar2;
  InternalException *this;
  pointer __dest;
  int64_t in_RSI;
  uint64_t in_RDI;
  size_type __dnew;
  type unsigned_in;
  type signed_in;
  hugeint_t local_98;
  uhugeint_t local_88;
  uhugeint_t local_78;
  string local_68;
  hugeint_t local_48;
  
  local_98.lower = in_RDI;
  local_98.upper = in_RSI;
  local_78 = hugeint_t::operator_cast_to_uhugeint_t(&local_98);
  local_48.lower = local_98.lower;
  local_48.upper = local_98.upper;
  hugeint_t::hugeint_t((hugeint_t *)&local_68,0);
  bVar1 = hugeint_t::operator<(&local_48,(hugeint_t *)&local_68);
  if (!bVar1) {
    uhugeint_t::uhugeint_t(&local_88,0xffffffffffffffff);
    bVar1 = uhugeint_t::operator>(&local_78,&local_88);
    if (!bVar1) {
      uVar2 = hugeint_t::operator_cast_to_unsigned_long(&local_98);
      return uVar2;
    }
  }
  params.upper = local_98.upper;
  params.lower = local_98.lower;
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_88.lower = 0x4b;
  __dest = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_88);
  uVar2 = local_88.lower;
  local_68.field_2._M_allocated_capacity = local_88.lower;
  local_68._M_dataplus._M_p = __dest;
  switchD_00b041bd::default
            (__dest,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             0x4b);
  local_68._M_string_length = uVar2;
  __dest[uVar2] = '\0';
  InternalException::InternalException<duckdb::hugeint_t,unsigned_long,unsigned_long>
            (this,&local_68,params,0,0xffffffffffffffff);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}